

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O0

bool node::DumpMempool(CTxMemPool *pool,path *dump_path,FopenFn *mockable_fopen_function,
                      bool skip_file_commit)

{
  long lVar1;
  seconds t;
  Span<std::byte> output;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  reference ppVar5;
  mapped_type *pmVar6;
  reference pTVar7;
  runtime_error *prVar8;
  byte in_CL;
  path *in_RSI;
  FILE *__stream;
  long in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> PVar9;
  exception *e;
  TxMempoolInfo *i_1;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *__range2_1;
  pair<const_uint256,_long> *i;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *__range2
  ;
  time_point last;
  iterator __end2_1;
  iterator __begin2_1;
  uint64_t mempool_transactions_to_write;
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  uint64_t version;
  time_point mid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> vinfo;
  time_point start;
  AutoFile file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffa6c;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_fffffffffffffa70;
  char *pcVar11;
  FastRandomContext *in_stack_fffffffffffffa78;
  AutoFile *this;
  duration<long,_std::ratio<1L,_1000000000L>_> d;
  function<_IO_FILE_*(const_fs::path_&,_const_char_*)> *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  CTxMemPool *in_stack_fffffffffffffa90;
  CTxMemPool *in_stack_fffffffffffffa98;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  FILE *in_stack_fffffffffffffaa8;
  AutoFile *in_stack_fffffffffffffab0;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffab8;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffac0;
  LogFlags in_stack_fffffffffffffad0;
  undefined2 uVar12;
  int in_stack_fffffffffffffadc;
  uint source_line;
  ConstevalFormatString<3U> in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  char *pcVar13;
  undefined7 in_stack_fffffffffffffb30;
  char *pcVar14;
  Level in_stack_fffffffffffffc10;
  bool local_3e9;
  double *in_stack_fffffffffffffc20;
  double *in_stack_fffffffffffffc28;
  unsigned_long *in_stack_fffffffffffffc30;
  undefined1 local_3b0 [48];
  AutoFile local_380;
  rep local_350;
  int64_t local_348;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_340;
  TxMempoolInfo *local_330;
  TxMempoolInfo *local_328;
  AutoFile local_300;
  char local_2c9 [25];
  long local_2b0;
  char local_2a8 [32];
  undefined8 local_288;
  _Base_ptr local_268;
  _Base_ptr local_260;
  undefined8 local_240;
  AutoFile local_238 [4];
  char local_170 [264];
  _IO_marker *local_8;
  
  local_8 = *(_IO_marker **)(in_FS_OFFSET + 0x28);
  local_240 = std::chrono::_V2::steady_clock::now();
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::map
            ((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
              *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::vector
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  if (DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
      ::dump_mutex == '\0') {
    iVar4 = __cxa_guard_acquire(&DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
                                 ::dump_mutex);
    if (iVar4 != 0) {
      __cxa_atexit(AnnotatedMixin<std::mutex>::~AnnotatedMixin,&DumpMempool::dump_mutex,
                   &__dso_handle);
      __cxa_guard_release(&DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
                           ::dump_mutex);
    }
  }
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffaa8,
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
             (char *)in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa8c,SUB41((uint)in_stack_fffffffffffffa88 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffaa8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
             (char *)in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa8c,SUB41((uint)in_stack_fffffffffffffa88 >> 0x18,0));
  local_260 = (_Base_ptr)
              std::
              map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
              ::begin((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                       *)in_stack_fffffffffffffa70);
  local_268 = (_Base_ptr)
              std::
              map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
              ::end((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                     *)in_stack_fffffffffffffa70);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffa78,(_Self *)in_stack_fffffffffffffa70);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_long>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<const_uint256,_long>_> *)
                        CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    lVar1 = ppVar5->second;
    pmVar6 = std::
             map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
             ::operator[]((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                           *)in_stack_fffffffffffffa90,
                          (key_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
    ;
    *pmVar6 = lVar1;
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_long>_> *)
               CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  }
  CTxMemPool::infoAll(in_stack_fffffffffffffa98);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::operator=
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)in_stack_fffffffffffffa78,
             (vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)in_stack_fffffffffffffa70);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)in_stack_fffffffffffffa78);
  CTxMemPool::GetUnbroadcastTxs(in_stack_fffffffffffffa90);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::operator=
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_fffffffffffffa78
             ,in_stack_fffffffffffffa70);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  local_288 = std::chrono::_V2::steady_clock::now();
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                 (path *)0x11ddfd2);
  fs::operator+((path *)in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
  std::function<_IO_FILE_*(const_fs::path_&,_const_char_*)>::operator()
            (in_stack_fffffffffffffa80,(path *)in_stack_fffffffffffffa78,
             (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  local_2a8[0] = '\0';
  local_2a8[1] = '\0';
  local_2a8[2] = '\0';
  local_2a8[3] = '\0';
  local_2a8[4] = '\0';
  local_2a8[5] = '\0';
  local_2a8[6] = '\0';
  local_2a8[7] = '\0';
  local_2a8[8] = '\0';
  local_2a8[9] = '\0';
  local_2a8[10] = '\0';
  local_2a8[0xb] = '\0';
  local_2a8[0xc] = '\0';
  local_2a8[0xd] = '\0';
  local_2a8[0xe] = '\0';
  local_2a8[0xf] = '\0';
  local_2a8[0x10] = '\0';
  local_2a8[0x11] = '\0';
  local_2a8[0x12] = '\0';
  local_2a8[0x13] = '\0';
  local_2a8[0x14] = '\0';
  local_2a8[0x15] = '\0';
  local_2a8[0x16] = '\0';
  local_2a8[0x17] = '\0';
  pcVar14 = local_2a8;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  AutoFile::AutoFile(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                     (vector<std::byte,_std::allocator<std::byte>_> *)
                     CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0));
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa78);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  uVar3 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68)
                          );
  if ((bool)uVar3) {
    local_3e9 = false;
  }
  else {
    local_2b0 = 2 - (ulong)(*(byte *)(in_RDI + 0x21b) & 1);
    AutoFile::operator<<
              ((AutoFile *)in_stack_fffffffffffffa78,(unsigned_long *)in_stack_fffffffffffffa70);
    pcVar13 = local_2c9;
    std::allocator<std::byte>::allocator
              ((allocator<std::byte> *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68)
              );
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa98,
               (size_type)in_stack_fffffffffffffa90,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    std::allocator<std::byte>::~allocator
              ((allocator<std::byte> *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68)
              );
    if ((*(byte *)(in_RDI + 0x21b) & 1) == 0) {
      in_stack_fffffffffffffb24 = 0;
      FastRandomContext::FastRandomContext
                (in_stack_fffffffffffffa78,SUB81((ulong)in_stack_fffffffffffffa70 >> 0x38,0));
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffffa78,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa70,
                 (type)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      in_stack_fffffffffffffb18.fmt = local_170;
      output.m_size._0_4_ = in_stack_fffffffffffffa88;
      output.m_data = (byte *)in_stack_fffffffffffffa80;
      output.m_size._4_4_ = in_stack_fffffffffffffa8c;
      FastRandomContext::fillrand
                ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                 output);
      FastRandomContext::~FastRandomContext
                ((FastRandomContext *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68))
      ;
      AutoFile::operator<<
                ((AutoFile *)in_stack_fffffffffffffa78,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa70);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    AutoFile::SetXor((AutoFile *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (vector<std::byte,_std::allocator<std::byte>_> *)0x11de329);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa78);
    local_300.m_file =
         (FILE *)std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::size
                           ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)
                            CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    AutoFile::operator<<
              ((AutoFile *)in_stack_fffffffffffffa78,(unsigned_long *)in_stack_fffffffffffffa70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80);
    this = &local_300;
    pcVar11 = "Writing %u mempool transactions to file...\n";
    uVar10 = 2;
    logging_function._M_len._7_1_ = uVar3;
    logging_function._M_len._0_7_ = in_stack_fffffffffffffb30;
    logging_function._M_str = pcVar14;
    source_file._M_len._4_4_ = in_stack_fffffffffffffb24;
    source_file._M_len._0_4_ = in_stack_fffffffffffffb20;
    source_file._M_str = pcVar13;
    LogPrintFormatInternal<unsigned_long>
              (logging_function,source_file,in_stack_fffffffffffffadc,in_stack_fffffffffffffad0,
               in_stack_fffffffffffffc10,(ConstevalFormatString<1U>)in_stack_fffffffffffffb18.fmt,
               (unsigned_long *)in_stack_fffffffffffffc20);
    local_328 = (TxMempoolInfo *)
                std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::begin
                          ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)pcVar11);
    local_330 = (TxMempoolInfo *)
                std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::end
                          ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)pcVar11);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                        ((__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                          *)this,(__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                                  *)pcVar11);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      pTVar7 = __gnu_cxx::
               __normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
               ::operator*((__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                            *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )this);
      PVar9 = TransactionSerParams::operator()((TransactionSerParams *)this,(CTransaction *)pcVar11)
      ;
      local_340 = PVar9;
      AutoFile::operator<<(this,(ParamsWrapper<TransactionSerParams,_const_CTransaction> *)pcVar11);
      local_350 = (pTVar7->m_time).__r;
      t.__r._4_4_ = in_stack_fffffffffffffa6c;
      t.__r._0_4_ = uVar10;
      local_348 = count_seconds(t);
      AutoFile::operator<<(this,(long *)pcVar11);
      local_380.m_position.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = pTVar7->nFeeDelta;
      AutoFile::operator<<(this,(long *)pcVar11);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
      CTransaction::GetHash((CTransaction *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
      std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::erase((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               *)this,(key_type *)pcVar11);
      __gnu_cxx::
      __normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
      ::operator++((__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                    *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
    }
    AutoFile::operator<<
              (this,(map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                     *)pcVar11);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80);
    local_380.m_file =
         (FILE *)std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::size
                           ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                            CONCAT44(in_stack_fffffffffffffa6c,uVar10));
    d.__r = (rep)&local_380;
    pcVar11 = "Writing %d unbroadcast transactions to file.\n";
    uVar10 = 2;
    logging_function_00._M_len._7_1_ = uVar3;
    logging_function_00._M_len._0_7_ = in_stack_fffffffffffffb30;
    logging_function_00._M_str = pcVar14;
    source_file_00._M_len._4_4_ = in_stack_fffffffffffffb24;
    source_file_00._M_len._0_4_ = in_stack_fffffffffffffb20;
    source_file_00._M_str = pcVar13;
    LogPrintFormatInternal<unsigned_long>
              (logging_function_00,source_file_00,in_stack_fffffffffffffadc,
               in_stack_fffffffffffffad0,in_stack_fffffffffffffc10,
               (ConstevalFormatString<1U>)in_stack_fffffffffffffb18.fmt,
               (unsigned_long *)in_stack_fffffffffffffc20);
    uVar12 = (undefined2)in_stack_fffffffffffffadc;
    __stream = (FILE *)&stack0xffffffffffffff98;
    AutoFile::operator<<
              ((AutoFile *)d.__r,
               (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)pcVar11);
    if ((in_CL & 1) == 0) {
      bVar2 = AutoFile::Commit((AutoFile *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
      if (!bVar2) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Commit failed");
        if (*(_IO_marker **)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_011dec98;
      }
    }
    AutoFile::fclose(local_238,__stream);
    fs::path::path((path *)CONCAT44(in_stack_fffffffffffffa6c,uVar10),(path *)0x11de775);
    fs::operator+((path *)in_stack_fffffffffffffa80,(char *)d.__r);
    fs::path::path((path *)CONCAT44(in_stack_fffffffffffffa6c,uVar10),(path *)0x11de7aa);
    bVar2 = RenameOver((path *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                       (path *)in_stack_fffffffffffffa80);
    source_line = CONCAT13(bVar2,CONCAT12(bVar2,uVar12)) ^ 0xff0000;
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
    if ((source_line & 0x10000) != 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Rename failed");
      if (*(_IO_marker **)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_011dec98;
    }
    local_3b0._40_8_ = std::chrono::_V2::steady_clock::now();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80);
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)pcVar11,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
    local_3b0._0_8_ =
         Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                   (d);
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)pcVar11,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffffa6c,uVar10));
    Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (d);
    std::filesystem::file_size(in_RSI);
    in_stack_fffffffffffffa78 = (FastRandomContext *)local_3b0;
    in_stack_fffffffffffffa68 = 2;
    logging_function_01._M_len._7_1_ = uVar3;
    logging_function_01._M_len._0_7_ = in_stack_fffffffffffffb30;
    logging_function_01._M_str = pcVar14;
    source_file_01._M_len._4_4_ = in_stack_fffffffffffffb24;
    source_file_01._M_len._0_4_ = in_stack_fffffffffffffb20;
    source_file_01._M_str = pcVar13;
    LogPrintFormatInternal<double,double,unsigned_long>
              (logging_function_01,source_file_01,source_line,in_stack_fffffffffffffad0,
               in_stack_fffffffffffffc10,in_stack_fffffffffffffb18,in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc28,in_stack_fffffffffffffc30);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffa78);
    local_3e9 = true;
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)in_stack_fffffffffffffa78);
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
  ~map((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *)
       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  if (*(_IO_marker **)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3e9;
  }
LAB_011dec98:
  __stack_chk_fail();
}

Assistant:

bool DumpMempool(const CTxMemPool& pool, const fs::path& dump_path, FopenFn mockable_fopen_function, bool skip_file_commit)
{
    auto start = SteadyClock::now();

    std::map<uint256, CAmount> mapDeltas;
    std::vector<TxMempoolInfo> vinfo;
    std::set<uint256> unbroadcast_txids;

    static Mutex dump_mutex;
    LOCK(dump_mutex);

    {
        LOCK(pool.cs);
        for (const auto &i : pool.mapDeltas) {
            mapDeltas[i.first] = i.second;
        }
        vinfo = pool.infoAll();
        unbroadcast_txids = pool.GetUnbroadcastTxs();
    }

    auto mid = SteadyClock::now();

    AutoFile file{mockable_fopen_function(dump_path + ".new", "wb")};
    if (file.IsNull()) {
        return false;
    }

    try {
        const uint64_t version{pool.m_opts.persist_v1_dat ? MEMPOOL_DUMP_VERSION_NO_XOR_KEY : MEMPOOL_DUMP_VERSION};
        file << version;

        std::vector<std::byte> xor_key(8);
        if (!pool.m_opts.persist_v1_dat) {
            FastRandomContext{}.fillrand(xor_key);
            file << xor_key;
        }
        file.SetXor(xor_key);

        uint64_t mempool_transactions_to_write(vinfo.size());
        file << mempool_transactions_to_write;
        LogInfo("Writing %u mempool transactions to file...\n", mempool_transactions_to_write);
        for (const auto& i : vinfo) {
            file << TX_WITH_WITNESS(*(i.tx));
            file << int64_t{count_seconds(i.m_time)};
            file << int64_t{i.nFeeDelta};
            mapDeltas.erase(i.tx->GetHash());
        }

        file << mapDeltas;

        LogInfo("Writing %d unbroadcast transactions to file.\n", unbroadcast_txids.size());
        file << unbroadcast_txids;

        if (!skip_file_commit && !file.Commit())
            throw std::runtime_error("Commit failed");
        file.fclose();
        if (!RenameOver(dump_path + ".new", dump_path)) {
            throw std::runtime_error("Rename failed");
        }
        auto last = SteadyClock::now();

        LogInfo("Dumped mempool: %.3fs to copy, %.3fs to dump, %d bytes dumped to file\n",
                  Ticks<SecondsDouble>(mid - start),
                  Ticks<SecondsDouble>(last - mid),
                  fs::file_size(dump_path));
    } catch (const std::exception& e) {
        LogInfo("Failed to dump mempool: %s. Continuing anyway.\n", e.what());
        return false;
    }
    return true;
}